

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O0

void canvas_undo_cleardirty(_glist *x)

{
  int iVar1;
  _glist *local_18;
  t_gobj *y;
  _glist *x_local;
  
  canvas_undo_docleardirty(x);
  for (local_18 = (_glist *)x->gl_list; local_18 != (_glist *)0x0;
      local_18 = (_glist *)(local_18->gl_obj).te_g.g_next) {
    if ((local_18->gl_obj).te_g.g_pd == canvas_class) {
      iVar1 = canvas_isabstraction(local_18);
      if (iVar1 == 0) {
        canvas_undo_cleardirty(local_18);
      }
    }
  }
  return;
}

Assistant:

void canvas_undo_cleardirty(t_canvas *x)
{
        /* clear dirty flags of this canvas
         * and all sub-canvases (but not abstractions/
         */
    t_gobj*y;
    canvas_undo_docleardirty(x);
    for(y=x->gl_list; y; y=y->g_next)
        if (pd_class(&y->g_pd) == canvas_class && !canvas_isabstraction((t_canvas*)y))
            canvas_undo_cleardirty((t_canvas*)y);
}